

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# REFPROP_lib.h
# Opt level: O3

bool load_REFPROP(string *err,string *shared_library_path,string *shared_library_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  char *pcVar3;
  bool bVar4;
  char *__s;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  string shared_lib;
  string msg;
  char rpv [1000];
  string local_4b8;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  undefined1 *local_458;
  char *local_450;
  undefined1 local_448;
  undefined7 uStack_447;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418 [31];
  
  bVar4 = true;
  if (RefpropdllInstance == (void *)0x0) {
    local_450 = (char *)0x0;
    local_448 = 0;
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    local_4b8._M_string_length = 0;
    local_4b8.field_2._M_local_buf[0] = '\0';
    local_458 = &local_448;
    std::__cxx11::string::_M_assign((string *)&local_4b8);
    RP_join_path(local_418,shared_library_path,&local_4b8);
    paVar1 = &local_418[0].field_2;
    RefpropdllInstance = (void *)dlopen(local_418[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_418[0]._M_dataplus._M_p,local_418[0].field_2._M_allocated_capacity + 1);
    }
    if (RefpropdllInstance == (void *)0x0) {
      __s = (char *)dlerror();
      pcVar3 = local_450;
      if (__s != (char *)0x0) {
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_458,0,pcVar3,(ulong)__s);
      }
    }
    else {
      RP_join_path(local_418,shared_library_path,&local_4b8);
      std::__cxx11::string::operator=((string *)&RPPath_loaded_abi_cxx11_,(string *)local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_418[0]._M_dataplus._M_p,local_418[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    if (RefpropdllInstance == (void *)0x0) {
      std::operator+(&local_438,"Could not load REFPROP (",&local_4b8);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_438);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_488 = *plVar6;
        lStack_480 = plVar5[3];
        local_498 = &local_488;
      }
      else {
        local_488 = *plVar6;
        local_498 = (long *)*plVar5;
      }
      local_490 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_498,(ulong)local_458);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_468 = *plVar6;
        lStack_460 = plVar5[3];
        local_478 = &local_468;
      }
      else {
        local_468 = *plVar6;
        local_478 = (long *)*plVar5;
      }
      local_470 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_478);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_418[0].field_2._0_8_ = *psVar7;
        local_418[0].field_2._8_8_ = plVar5[3];
        local_418[0]._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_418[0].field_2._0_8_ = *psVar7;
        local_418[0]._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_418[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_418[0]._M_dataplus._M_p,local_418[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_478 != &local_468) {
        operator_delete(local_478,local_468 + 1);
      }
      if (local_498 != &local_488) {
        operator_delete(local_498,local_488 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)err);
      std::__cxx11::string::append((char *)err);
      bVar4 = false;
    }
    else {
      bVar4 = setFunctionPointers(err);
      if (bVar4) {
        memset(local_418,0,1000);
        (*(code *)RPVersion)(local_418);
        sVar2 = RPVersion_loaded_abi_cxx11_._M_string_length;
        strlen((char *)local_418);
        std::__cxx11::string::_M_replace(0x10f6e0,0,(char *)sVar2,(ulong)local_418);
        bVar4 = true;
      }
      else {
        bVar4 = false;
        std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x107879);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,
                      CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                               local_4b8.field_2._M_local_buf[0]) + 1);
    }
    if (local_458 != &local_448) {
      operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
    }
  }
  return bVar4;
}

Assistant:

bool load_REFPROP(std::string &err, const std::string &shared_library_path, const std::string &shared_library_name)
    {
        // If REFPROP is not loaded
        if (RefpropdllInstance == NULL)
        {
            // Load it
            std::string msg;
            std::string shared_lib;
            if (shared_library_name.empty()) 
            {
                shared_lib = get_shared_lib();
            } else {
                shared_lib = shared_library_name;
            }
            #if defined(__RPISWINDOWS__)
                // Load the DLL
                TCHAR refpropdllstring[_MAX_PATH];
                strcpy((char*)refpropdllstring, RP_join_path(shared_library_path, shared_lib).c_str());
                RefpropdllInstance = LoadLibrary(refpropdllstring);
                // Error handling
                if (RefpropdllInstance == NULL)
                {
                    std::stringstream msg_stream;
                    msg_stream << GetLastError(); // returns error
                    msg = msg_stream.str();
                } else {
                    TCHAR dllPath[_MAX_PATH];
                    HMODULE hModule;
                    hModule = GetModuleHandle(refpropdllstring);
                    GetModuleFileName(hModule, dllPath, _MAX_PATH);
                    #ifndef UNICODE
                        msg = dllPath;
                    #else
                        std::wstring wStr = dllPath;
                        msg = std::string(wStr.begin(), wStr.end());
                    #endif
                    RPPath_loaded = msg;
                }
            #elif ( defined(__RPISLINUX__) || defined(__RPISAPPLE__) )
                // Load library
                RefpropdllInstance = dlopen (RP_join_path(shared_library_path, shared_lib).c_str(), RTLD_NOW); 
                // Error handling
                if (RefpropdllInstance == NULL) 
                {
                    const char *errstr = dlerror();
                    if (errstr != NULL) 
                    {
                        msg = errstr;
                    }
                } else {
                    RPPath_loaded = RP_join_path(shared_library_path, shared_lib);
                }
            #else
                RefpropdllInstance = NULL;
                RPPath_loaded = "";
                msg = "Something is wrong with the platform definition, you should not end up here.";
            #endif

            if (RefpropdllInstance == NULL)
            {
                err = "Could not load REFPROP (" + shared_lib + ") due to: " + msg + ". ";
                err.append("Make sure the library is in your system search path. ");
                err.append("In case you run 64bit Windows and you have a REFPROP license, try installing the 64bit DLL from NIST. ");
                return false;
            }
            if (setFunctionPointers(err) != true)
            {
                err = "There was an error setting the REFPROP function pointers, check types and names in header file.";
                return false;
            }
            char rpv[versionstringlength] = { '\0' };
            RPVersion(rpv, versionstringlength);
            RPVersion_loaded = rpv;
            return true;
        }
        return true;
    }